

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

AnyCellmlElementPtr __thiscall
libcellml::Annotator::AnnotatorImpl::convertToShared(AnnotatorImpl *this,AnyCellmlElementPtr *item)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CellmlElementType type_00;
  CellmlElementType CVar2;
  element_type *peVar3;
  __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  AnyCellmlElementPtr AVar4;
  any local_1d8;
  shared_ptr<libcellml::Variable> local_1c8;
  any local_1b8;
  shared_ptr<libcellml::Units> local_1a8;
  shared_ptr<libcellml::UnitsItem> local_198;
  any local_188;
  shared_ptr<libcellml::Reset> local_178;
  any local_168;
  shared_ptr<libcellml::Reset> local_158;
  any local_148;
  shared_ptr<libcellml::Reset> local_138;
  any local_128;
  shared_ptr<libcellml::ImportSource> local_118;
  any local_108;
  shared_ptr<libcellml::Model> local_f8;
  shared_ptr<libcellml::VariablePair> local_e8;
  any local_d8;
  shared_ptr<libcellml::Component> local_c8;
  undefined1 local_b8 [8];
  VariablePairPtr variablePair;
  VariablePtr variable;
  UnitsItemPtr unitsItem;
  UnitsPtr units;
  ResetPtr reset;
  ModelPtr model;
  ImportSourcePtr importSource;
  ComponentPtr component;
  CellmlElementType type;
  AnyCellmlElementPtr *item_local;
  AnnotatorImpl *this_local;
  AnyCellmlElementPtr *converted;
  
  AnyCellmlElement::AnyCellmlElementImpl::create();
  peVar3 = std::
           __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RDX);
  type_00 = AnyCellmlElement::type(peVar3);
  std::shared_ptr<libcellml::Component>::shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::ImportSource>::shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Reset>::shared_ptr
            ((shared_ptr<libcellml::Reset> *)
             &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Units>::shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::UnitsItem>::shared_ptr
            ((shared_ptr<libcellml::UnitsItem> *)
             &variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Variable>::shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::VariablePair>::shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_b8);
  peVar3 = std::
           __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RDX);
  CVar2 = AnyCellmlElement::type(peVar3);
  switch(CVar2) {
  case COMPONENT:
  case COMPONENT_REF:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::Component>>(&local_d8);
    std::weak_ptr<libcellml::Component>::lock((weak_ptr<libcellml::Component> *)&local_c8);
    p_Var1 = &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<libcellml::Component>::operator=
              ((shared_ptr<libcellml::Component> *)p_Var1,&local_c8);
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c8);
    std::weak_ptr<libcellml::Component>::~weak_ptr((weak_ptr<libcellml::Component> *)&local_d8);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setComponent
              (peVar3->mPimpl,(ComponentPtr *)p_Var1,type_00);
    break;
  case CONNECTION:
  case MAP_VARIABLES:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::variablePair((AnyCellmlElement *)&local_e8);
    std::shared_ptr<libcellml::VariablePair>::operator=
              ((shared_ptr<libcellml::VariablePair> *)local_b8,&local_e8);
    std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_e8);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setVariablePair
              (peVar3->mPimpl,(shared_ptr<libcellml::VariablePair> *)local_b8,type_00);
    break;
  case ENCAPSULATION:
  case MODEL:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::Model>>(&local_108);
    std::weak_ptr<libcellml::Model>::lock((weak_ptr<libcellml::Model> *)&local_f8);
    p_Var1 = &reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<libcellml::Model>::operator=((shared_ptr<libcellml::Model> *)p_Var1,&local_f8);
    std::shared_ptr<libcellml::Model>::~shared_ptr(&local_f8);
    std::weak_ptr<libcellml::Model>::~weak_ptr((weak_ptr<libcellml::Model> *)&local_108);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setModel(peVar3->mPimpl,(ModelPtr *)p_Var1,type_00);
    break;
  case IMPORT:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::ImportSource>>(&local_128);
    std::weak_ptr<libcellml::ImportSource>::lock((weak_ptr<libcellml::ImportSource> *)&local_118);
    p_Var1 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<libcellml::ImportSource>::operator=
              ((shared_ptr<libcellml::ImportSource> *)p_Var1,&local_118);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_118);
    std::weak_ptr<libcellml::ImportSource>::~weak_ptr
              ((weak_ptr<libcellml::ImportSource> *)&local_128);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              (peVar3->mPimpl,(ImportSourcePtr *)p_Var1);
    break;
  default:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::Variable>>(&local_1d8);
    std::weak_ptr<libcellml::Variable>::lock((weak_ptr<libcellml::Variable> *)&local_1c8);
    p_Var1 = &variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<libcellml::Variable>::operator=
              ((shared_ptr<libcellml::Variable> *)p_Var1,&local_1c8);
    std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1c8);
    std::weak_ptr<libcellml::Variable>::~weak_ptr((weak_ptr<libcellml::Variable> *)&local_1d8);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setVariable(peVar3->mPimpl,(VariablePtr *)p_Var1);
    break;
  case RESET:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::Reset>>(&local_148);
    std::weak_ptr<libcellml::Reset>::lock((weak_ptr<libcellml::Reset> *)&local_138);
    p_Var1 = &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<libcellml::Reset>::operator=((shared_ptr<libcellml::Reset> *)p_Var1,&local_138);
    std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_138);
    std::weak_ptr<libcellml::Reset>::~weak_ptr((weak_ptr<libcellml::Reset> *)&local_148);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setReset(peVar3->mPimpl,(ResetPtr *)p_Var1,RESET);
    break;
  case RESET_VALUE:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::Reset>>(&local_168);
    std::weak_ptr<libcellml::Reset>::lock((weak_ptr<libcellml::Reset> *)&local_158);
    p_Var1 = &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<libcellml::Reset>::operator=((shared_ptr<libcellml::Reset> *)p_Var1,&local_158);
    std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_158);
    std::weak_ptr<libcellml::Reset>::~weak_ptr((weak_ptr<libcellml::Reset> *)&local_168);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setResetValue(peVar3->mPimpl,(ResetPtr *)p_Var1);
    break;
  case TEST_VALUE:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::Reset>>(&local_188);
    std::weak_ptr<libcellml::Reset>::lock((weak_ptr<libcellml::Reset> *)&local_178);
    p_Var1 = &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<libcellml::Reset>::operator=((shared_ptr<libcellml::Reset> *)p_Var1,&local_178);
    std::shared_ptr<libcellml::Reset>::~shared_ptr(&local_178);
    std::weak_ptr<libcellml::Reset>::~weak_ptr((weak_ptr<libcellml::Reset> *)&local_188);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setTestValue(peVar3->mPimpl,(ResetPtr *)p_Var1);
    break;
  case UNIT:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    AnyCellmlElement::unitsItem((AnyCellmlElement *)&local_198);
    p_Var1 = &variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<libcellml::UnitsItem>::operator=
              ((shared_ptr<libcellml::UnitsItem> *)p_Var1,&local_198);
    std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_198);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setUnitsItem(peVar3->mPimpl,(UnitsItemPtr *)p_Var1);
    break;
  case UNITS:
    std::__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_RDX);
    std::any_cast<std::weak_ptr<libcellml::Units>>(&local_1b8);
    std::weak_ptr<libcellml::Units>::lock((weak_ptr<libcellml::Units> *)&local_1a8);
    p_Var1 = &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    std::shared_ptr<libcellml::Units>::operator=((shared_ptr<libcellml::Units> *)p_Var1,&local_1a8);
    std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1a8);
    std::weak_ptr<libcellml::Units>::~weak_ptr((weak_ptr<libcellml::Units> *)&local_1b8);
    peVar3 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar3->mPimpl,(UnitsPtr *)p_Var1);
  }
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_b8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr
            ((shared_ptr<libcellml::UnitsItem> *)
             &variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &unitsItem.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)
             &units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &reset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::AnnotatorImpl::convertToShared(const AnyCellmlElementPtr &item)
{
    auto converted = AnyCellmlElement::AnyCellmlElementImpl::create();
    auto type = item->type();

    ComponentPtr component;
    ImportSourcePtr importSource;
    ModelPtr model;
    ResetPtr reset;
    UnitsPtr units;
    UnitsItemPtr unitsItem;
    VariablePtr variable;
    VariablePairPtr variablePair;

    switch (item->type()) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF:
        component = std::any_cast<ComponentWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setComponent(component, type);
        break;
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
        variablePair = item->variablePair();
        converted->mPimpl->setVariablePair(variablePair, type);
        break;
    case CellmlElementType::ENCAPSULATION:
    case CellmlElementType::MODEL:
        model = std::any_cast<ModelWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setModel(model, type);
        break;
    case CellmlElementType::IMPORT:
        importSource = std::any_cast<ImportSourceWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setImportSource(importSource);
        break;
    case CellmlElementType::RESET:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setReset(reset);
        break;
    case CellmlElementType::RESET_VALUE:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setResetValue(reset);
        break;
    case CellmlElementType::TEST_VALUE:
        reset = std::any_cast<ResetWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setTestValue(reset);
        break;
    case CellmlElementType::UNIT:
        unitsItem = item->unitsItem();
        converted->mPimpl->setUnitsItem(unitsItem);
        break;
    case CellmlElementType::UNITS:
        units = std::any_cast<UnitsWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setUnits(units);
        break;
    default: /* CellmlElementType::VARIABLE */
        variable = std::any_cast<VariableWeakPtr>(item->mPimpl->mItem).lock();
        converted->mPimpl->setVariable(variable);
        break;
    }

    return converted;
}